

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian32(CodedInputStream *this,uint32_t *value)

{
  int iVar1;
  uint8_t *puVar2;
  uint32_t *value_local;
  CodedInputStream *this_local;
  
  iVar1 = BufferSize(this);
  if (iVar1 < 4) {
    this_local._7_1_ = ReadLittleEndian32Fallback(this,value);
  }
  else {
    puVar2 = ReadLittleEndian32FromArray(this->buffer_,value);
    this->buffer_ = puVar2;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool CodedInputStream::ReadLittleEndian32(uint32_t* value) {
#if defined(PROTOBUF_LITTLE_ENDIAN)
  if (PROTOBUF_PREDICT_TRUE(BufferSize() >= static_cast<int>(sizeof(*value)))) {
    buffer_ = ReadLittleEndian32FromArray(buffer_, value);
    return true;
  } else {
    return ReadLittleEndian32Fallback(value);
  }
#else
  return ReadLittleEndian32Fallback(value);
#endif
}